

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool argparse::Argument::is_decimal_literal(string_view s)

{
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  bool bVar1;
  int iVar2;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar3;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  string_view s_04;
  string_view s_05;
  string_view s_06;
  string_view s_07;
  string_view s_08;
  string_view s_09;
  string_view s_10;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_108;
  Argument *local_b8;
  Argument *local_68;
  Argument *local_48;
  char *local_40;
  anon_class_1_1_ee830756 local_22;
  _lambda_auto_1__1_ local_21;
  undefined1 auStack_20 [6];
  anon_class_1_1_ee830756 consume_digits;
  anon_class_1_0_00000001 is_digit;
  string_view s_local;
  
  s_04._M_len = s._M_str;
  _auStack_20 = (Argument *)s._M_len;
  s_04._M_str = in_RDX;
  iVar2 = lookahead(_auStack_20,s_04);
  if (iVar2 == 0x2e) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
    pcVar3 = extraout_RDX_00;
    s_local._M_len = (size_t)s_04._M_len;
LAB_00114994:
    s_07._M_str = pcVar3;
    s_07._M_len = s_local._M_len;
    iVar2 = lookahead(_auStack_20,s_07);
    bVar1 = is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::
            {lambda(auto:1)#1}::operator()(&local_21,iVar2);
    if (!bVar1) {
      return false;
    }
    s_01._M_str = (char *)s_local._M_len;
    s_01._M_len = (size_t)_auStack_20;
    bVar4 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_22,s_01);
    pcVar3 = bVar4._M_str;
    local_b8 = (Argument *)bVar4._M_len;
    _auStack_20 = local_b8;
    s_local._M_len = (size_t)pcVar3;
  }
  else {
    if (iVar2 == 0x30) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      if (bVar1) {
        return true;
      }
      s_02._M_str = s_04._M_len;
      s_02._M_len = (size_t)_auStack_20;
      bVar4 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_22,s_02);
      pcVar3 = bVar4._M_str;
      local_68 = (Argument *)bVar4._M_len;
      _auStack_20 = local_68;
      s_local._M_len = (size_t)pcVar3;
    }
    else {
      if (8 < iVar2 - 0x31U) {
        return false;
      }
      s_03._M_str = s_04._M_len;
      s_03._M_len = (size_t)_auStack_20;
      bVar4 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_22,s_03);
      local_48 = (Argument *)bVar4._M_len;
      _auStack_20 = local_48;
      local_40 = bVar4._M_str;
      s_local._M_len = (size_t)local_40;
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      pcVar3 = extraout_RDX;
      if (bVar1) {
        return true;
      }
    }
    s_05._M_str = pcVar3;
    s_05._M_len = s_local._M_len;
    iVar2 = lookahead(_auStack_20,s_05);
    if (iVar2 != 0x2e) {
      if ((iVar2 != 0x45) && (iVar2 != 0x65)) {
        return false;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
      pcVar3 = extraout_RDX_03;
      goto LAB_00114a93;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
    s_06._M_str = extraout_RDX_01;
    s_06._M_len = s_local._M_len;
    iVar2 = lookahead(_auStack_20,s_06);
    bVar1 = is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::
            {lambda(auto:1)#1}::operator()(&local_21,iVar2);
    pcVar3 = extraout_RDX_02;
    if (bVar1) goto LAB_00114994;
  }
  s_08._M_str = pcVar3;
  s_08._M_len = s_local._M_len;
  iVar2 = lookahead(_auStack_20,s_08);
  if (iVar2 == -1) {
    return true;
  }
  if ((iVar2 != 0x45) && (iVar2 != 0x65)) {
    return false;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
  pcVar3 = extraout_RDX_04;
LAB_00114a93:
  s_09._M_str = pcVar3;
  s_09._M_len = s_local._M_len;
  iVar2 = lookahead(_auStack_20,s_09);
  if ((iVar2 == 0x2b) || (pcVar3 = extraout_RDX_05, iVar2 == 0x2d)) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1);
    pcVar3 = extraout_RDX_06;
  }
  s_10._M_str = pcVar3;
  s_10._M_len = s_local._M_len;
  iVar2 = lookahead(_auStack_20,s_10);
  bVar1 = is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::
          {lambda(auto:1)#1}::operator()(&local_21,iVar2);
  if (bVar1) {
    s_00._M_str = (char *)s_local._M_len;
    s_00._M_len = (size_t)_auStack_20;
    bVar4 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_22,s_00);
    local_108 = bVar4._M_len;
    _auStack_20 = (Argument *)local_108;
    s_local._M_str._7_1_ =
         std::basic_string_view<char,_std::char_traits<char>_>::empty
                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  }
  else {
    s_local._M_str._7_1_ = false;
  }
  return s_local._M_str._7_1_;
}

Assistant:

static bool is_decimal_literal(std::string_view s) {
    auto is_digit = [](auto c) constexpr {
      switch (c) {
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return true;
      default:
        return false;
      }
    };

    // precondition: we have consumed or will consume at least one digit
    auto consume_digits = [=](std::string_view s) {
      auto it = std::find_if_not(begin(s), end(s), is_digit);
      return s.substr(it - begin(s));
    };

    switch (lookahead(s)) {
    case '0': {
      s.remove_prefix(1);
      if (s.empty())
        return true;
      else
        goto integer_part;
    }
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
      s = consume_digits(s);
      if (s.empty())
        return true;
      else
        goto integer_part_consumed;
    }
    case '.': {
      s.remove_prefix(1);
      goto post_decimal_point;
    }
    default:
      return false;
    }

  integer_part:
    s = consume_digits(s);
  integer_part_consumed:
    switch (lookahead(s)) {
    case '.': {
      s.remove_prefix(1);
      if (is_digit(lookahead(s)))
        goto post_decimal_point;
      else
        goto exponent_part_opt;
    }
    case 'e':
    case 'E': {
      s.remove_prefix(1);
      goto post_e;
    }
    default:
      return false;
    }

  post_decimal_point:
    if (is_digit(lookahead(s))) {
      s = consume_digits(s);
      goto exponent_part_opt;
    } else {
      return false;
    }

  exponent_part_opt:
    switch (lookahead(s)) {
    case eof:
      return true;
    case 'e':
    case 'E': {
      s.remove_prefix(1);
      goto post_e;
    }
    default:
      return false;
    }

  post_e:
    switch (lookahead(s)) {
    case '-':
    case '+':
      s.remove_prefix(1);
    }
    if (is_digit(lookahead(s))) {
      s = consume_digits(s);
      return s.empty();
    } else {
      return false;
    }
  }